

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromBarBufs(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Nm_Man_t *pNVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  Abc_Des_t *pAVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  char *pcVar10;
  undefined8 uVar11;
  int iVar12;
  Vec_Ptr_t *p;
  int iVar13;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  
  if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
    __assert_fail("pNtkBase->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10d,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10e,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x10f,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkBase->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x110,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != pNtk->nBarBufs) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x111,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x112,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x113,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPis->nSize == pNtkBase->vPis->nSize) {
    if (pNtk->vPos->nSize != pNtkBase->vPos->nSize) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x115,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Abc_NtkCleanCopy_rec(pNtkBase);
    iVar12 = 0;
    while( true ) {
      pAVar7 = pNtkBase->pDesign;
      p = pAVar7->vModules;
      iVar13 = p->nSize;
      if (iVar13 <= iVar12) break;
      pAVar3 = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar12);
      pAVar4 = Abc_NtkStartFrom(pAVar3,pNtk->ntkType,pNtk->ntkFunc);
      pAVar3->pCopy = pAVar4;
      iVar12 = iVar12 + 1;
    }
    for (iVar12 = 0; iVar12 < iVar13; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry(p,iVar12);
      if (*(long *)((long)pvVar5 + 0xb8) == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(undefined8 *)(*(long *)((long)pvVar5 + 0xb8) + 0x160);
      }
      *(undefined8 *)(*(long *)((long)pvVar5 + 0x160) + 0xb8) = uVar11;
      pAVar7 = pNtkBase->pDesign;
      p = pAVar7->vModules;
      iVar13 = p->nSize;
    }
    for (iVar12 = 0; iVar12 < iVar13; iVar12 = iVar12 + 1) {
      pAVar3 = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar12);
      for (iVar13 = 0; iVar13 < pAVar3->vBoxes->nSize; iVar13 = iVar13 + 1) {
        pAVar6 = Abc_NtkBox(pAVar3,iVar13);
        if ((*(uint *)&pAVar6->field_0x14 & 0xf) - 9 < 2) {
          pAVar4 = Abc_ObjModel(pAVar6);
          ((pAVar6->field_6).pCopy)->field_5 =
               (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar4->pCopy;
        }
      }
      pAVar7 = pNtkBase->pDesign;
      p = pAVar7->vModules;
      iVar13 = p->nSize;
    }
    pAVar3 = pNtkBase->pCopy;
    pAVar7 = Abc_DesCreate(pAVar7->pName);
    pAVar3->pDesign = pAVar7;
    iVar12 = 0;
    while( true ) {
      pAVar7 = pNtkBase->pDesign;
      if (pAVar7->vModules->nSize <= iVar12) break;
      pvVar5 = Vec_PtrEntry(pAVar7->vModules,iVar12);
      Abc_DesAddModel(pAVar3->pDesign,*(Abc_Ntk_t **)((long)pvVar5 + 0x160));
      iVar12 = iVar12 + 1;
    }
    for (iVar12 = 0; iVar12 < pAVar7->vTops->nSize; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry(pAVar7->vTops,iVar12);
      Vec_PtrPush(pAVar3->pDesign->vTops,*(void **)((long)pvVar5 + 0x160));
      pAVar7 = pNtkBase->pDesign;
    }
    iVar12 = 0;
    pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar3->pDesign->vTops,0);
    if (pAVar4 == pAVar3) {
      Abc_NtkCleanCopy(pNtk);
      for (; iVar12 < pNtk->vPis->nSize; iVar12 = iVar12 + 1) {
        pAVar6 = Abc_NtkPi(pNtk,iVar12);
        pAVar8 = Abc_NtkPi(pAVar3,iVar12);
        (pAVar6->field_6).pCopy = pAVar8;
      }
      for (iVar12 = 0; iVar12 < pNtk->vPos->nSize; iVar12 = iVar12 + 1) {
        pAVar6 = Abc_NtkPo(pNtk,iVar12);
        pAVar8 = Abc_NtkPo(pAVar3,iVar12);
        (pAVar6->field_6).pCopy = pAVar8;
      }
      Abc_NtkCollectPiPos(pNtkBase,&vLiMaps,&vLoMaps);
      iVar12 = vLiMaps->nSize;
      if (iVar12 == pNtk->nObjCounts[8]) {
        if (vLoMaps->nSize == iVar12) {
          for (iVar13 = 0; iVar13 < iVar12; iVar13 = iVar13 + 1) {
            pvVar5 = Vec_PtrEntry(vLiMaps,iVar13);
            pvVar9 = Vec_PtrEntry(vLoMaps,iVar13);
            pAVar6 = Abc_NtkBox(pNtk,iVar13);
            *(undefined8 *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x40) =
                 *(undefined8 *)((long)pvVar5 + 0x40);
            *(undefined8 *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray] + 0x40) =
                 *(undefined8 *)((long)pvVar9 + 0x40);
            iVar12 = vLiMaps->nSize;
          }
          Vec_PtrFree(vLiMaps);
          Vec_PtrFree(vLoMaps);
          for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
            pAVar8 = Abc_NtkCo(pNtk,iVar12);
            pAVar6 = (pAVar8->field_6).pCopy;
            pAVar8 = Abc_NtkFromBarBufs_rec
                               (pAVar6->pNtk,
                                (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray])
            ;
            Abc_ObjAddFanin(pAVar6,pAVar8);
          }
          for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
            pAVar8 = Abc_NtkCi(pNtk,iVar12);
            pAVar6 = (pAVar8->field_6).pCopy;
            if ((pAVar6->vFanouts).nSize == 0) {
              pAVar6 = Abc_NtkCreateObj(pAVar6->pNtk,ABC_OBJ_NET);
              Abc_ObjAddFanin(pAVar6,(pAVar8->field_6).pCopy);
              pAVar6 = (pAVar8->field_6).pCopy;
            }
            pNVar2 = pAVar6->pNtk->pManName;
            pvVar5 = pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
            iVar13 = *(int *)((long)pvVar5 + 0x10);
            uVar1 = *(uint *)((long)pvVar5 + 0x14);
            pcVar10 = Abc_ObjName((Abc_Obj_t *)
                                  pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray]);
            Nm_ManStoreIdName(pNVar2,iVar13,uVar1 & 0xf,pcVar10,(char *)0x0);
          }
          for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
            pAVar6 = Abc_NtkCo(pNtk,iVar12);
            pAVar4 = ((pAVar6->field_6).pCopy)->pNtk;
            pNVar2 = pAVar4->pManName;
            pvVar5 = pAVar4->vObjs->pArray[*(((pAVar6->field_6).pCopy)->vFanins).pArray];
            iVar13 = *(int *)((long)pvVar5 + 0x10);
            uVar1 = *(uint *)((long)pvVar5 + 0x14);
            pcVar10 = Abc_ObjName((Abc_Obj_t *)
                                  pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray]);
            Nm_ManStoreIdName(pNVar2,iVar13,uVar1 & 0xf,pcVar10,(char *)0x0);
          }
          return pAVar3;
        }
        __assert_fail("Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                      ,0x131,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      __assert_fail("Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                    ,0x130,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    __assert_fail("Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x128,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                ,0x114,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromBarBufs( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k;
    assert( pNtkBase->pDesign != NULL );
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkIsNetlist(pNtkBase) );
    assert( Abc_NtkLatchNum(pNtkBase) == 0 );
    assert( Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase) );
    // start networks
    Abc_NtkCleanCopy_rec( pNtkBase );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy = Abc_NtkStartFrom( pTemp, pNtk->ntkType, pNtk->ntkFunc );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    // create the design
    pNtkNew = pNtkBase->pCopy;
    pNtkNew->pDesign = Abc_DesCreate( pNtkBase->pDesign->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_DesAddModel( pNtkNew->pDesign, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vTops, pTemp, i )
        Vec_PtrPush( pNtkNew->pDesign->vTops, pTemp->pCopy );
    assert( Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew );
    // transfer copy attributes to pNtk
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPo(pNtkNew, i);
    Abc_NtkCollectPiPos( pNtkBase, &vLiMaps, &vLoMaps );
    assert( Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk) );
    assert( Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk) );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObj = Abc_NtkBox( pNtk, i );
        Abc_ObjFanin0(pObj)->pCopy = pLiMap->pCopy; 
        Abc_ObjFanout0(pObj)->pCopy = pLoMap->pCopy; 
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // create internal nodes
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pObj->pCopy->pNtk, Abc_ObjFanin0(pObj)) );
    // transfer net names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj->pCopy) == 0 ) // handle PI without fanout
            Abc_ObjAddFanin( Abc_NtkCreateNet(pObj->pCopy->pNtk), pObj->pCopy );
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanout0(pObj->pCopy)->Id, Abc_ObjFanout0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanin0(pObj->pCopy)->Id, Abc_ObjFanin0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanin0(pObj)), NULL );
    return pNtkNew;
}